

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jemalloc.c
# Opt level: O1

void duckdb_je_free_default(void *ptr)

{
  rtree_ctx_cache_elm_t *prVar1;
  ulong *puVar2;
  rtree_leaf_elm_t *prVar3;
  void *pvVar4;
  uint64_t uVar5;
  size_t __n;
  rtree_leaf_elm_t *prVar6;
  ushort uVar7;
  tsd_t *tsd;
  rtree_leaf_elm_t *prVar8;
  ulong uVar9;
  ulong uVar10;
  void **ppvVar11;
  uintptr_t in_RCX;
  cache_bin_t *bin_1;
  cache_bin_t *pcVar12;
  rtree_ctx_cache_elm_t *prVar13;
  rtree_ctx_cache_elm_t *prVar14;
  uintptr_t in_R8;
  undefined7 uVar15;
  tcache_t *ptVar16;
  rtree_t *prVar17;
  szind_t binind;
  cache_bin_t *bin;
  rtree_ctx_t *ctx;
  rtree_metadata_t rVar18;
  uintptr_t args_raw [3];
  rtree_ctx_t rtree_ctx_fallback;
  rtree_contents_t local_1e0;
  void *local_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  _Bool local_1b0;
  undefined8 local_1a8;
  undefined8 local_1a0;
  undefined8 local_198;
  undefined8 local_190;
  
  if (ptr == (void *)0x0) {
    return;
  }
  tsd = (tsd_t *)__tls_get_addr();
  if ((tsd->state).repr != '\0') {
    tsd = duckdb_je_tsd_fetch_slow(tsd,true);
  }
  if ((tsd->state).repr != '\0') {
    if (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level == '\0') {
      ptVar16 = (tcache_t *)0x0;
      if (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled != false) {
        ptVar16 = &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache;
      }
    }
    else {
      ptVar16 = (tcache_t *)0x0;
    }
    local_1c0 = 0;
    uStack_1b8 = 0;
    local_1c8 = ptr;
    duckdb_je_hook_invoke_dalloc(hook_dalloc_free,ptr,(uintptr_t *)&local_1c8);
    if (tsd == (tsd_t *)0x0) {
      prVar17 = (rtree_t *)&stack0xfffffffffffffe50;
      duckdb_je_rtree_ctx_data_init((rtree_ctx_t *)prVar17);
    }
    else {
      prVar17 = (rtree_t *)&tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
    }
    rVar18 = rtree_metadata_read((tsdn_t *)tsd,prVar17,(rtree_ctx_t *)ptr,in_RCX);
    uVar10 = rVar18._0_8_;
    binind = rVar18.szind;
    __n = duckdb_je_sz_index2size_tab[uVar10 & 0xffffffff];
    if (duckdb_je_opt_junk_free == true) {
      switchD_0130b471::default(ptr,0x5a,__n);
    }
    if (ptVar16 == (tcache_t *)0x0) {
      arena_dalloc_no_tcache((tsdn_t *)tsd,ptr);
    }
    else if ((rVar18._8_4_ >> 8 & 1) == 0) {
      if (binind < ptVar16->tcache_slow->tcache_nbins) {
        uVar10 = uVar10 & 0xffffffff;
        ppvVar11 = ptVar16->bins[uVar10].stack_head;
        if (ppvVar11 != (void **)&duckdb_je_disabled_bin) {
          pcVar12 = ptVar16->bins + uVar10;
          if (ptVar16->bins[uVar10].low_bits_full == (uint16_t)ppvVar11) {
            duckdb_je_tcache_bin_flush_large
                      (tsd,ptVar16,pcVar12,binind,
                       (uint)(ptVar16->bins[uVar10].bin_info.ncached_max >>
                             ((byte)duckdb_je_opt_lg_tcache_flush_large_div & 0x1f)));
            goto LAB_01d8c4b6;
          }
          goto LAB_01d8c1d4;
        }
      }
      if (tsd == (tsd_t *)0x0) {
        prVar17 = (rtree_t *)&stack0xfffffffffffffe50;
        duckdb_je_rtree_ctx_data_init((rtree_ctx_t *)prVar17);
      }
      else {
        prVar17 = (rtree_t *)&tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
      }
      rtree_read(&local_1e0,(tsdn_t *)tsd,prVar17,(rtree_ctx_t *)ptr,in_R8);
      duckdb_je_large_dalloc((tsdn_t *)tsd,local_1e0.edata);
    }
    else {
      uVar10 = uVar10 & 0xffffffff;
      pcVar12 = ptVar16->bins + uVar10;
      ppvVar11 = pcVar12->stack_head;
      if (ptVar16->bins[uVar10].low_bits_full == (uint16_t)ppvVar11) {
        if (pcVar12->stack_head == (void **)&duckdb_je_disabled_bin) {
          duckdb_je_arena_dalloc_small((tsdn_t *)tsd,ptr);
        }
        else {
          duckdb_je_tcache_bin_flush_small
                    (tsd,ptVar16,pcVar12,binind,
                     (uint)(ptVar16->bins[uVar10].bin_info.ncached_max >>
                           ((byte)duckdb_je_opt_lg_tcache_flush_small_div & 0x1f)));
LAB_01d8c4b6:
          ppvVar11 = pcVar12->stack_head;
          if (pcVar12->low_bits_full != (uint16_t)ppvVar11) goto LAB_01d8c1d4;
        }
      }
      else {
LAB_01d8c1d4:
        pcVar12->stack_head = ppvVar11 + -1;
        ppvVar11[-1] = ptr;
      }
    }
    uVar5 = tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated;
    tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated = uVar5 + __n;
    if (__n < tsd->
              cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated_next_event -
              uVar5) {
      return;
    }
    goto LAB_01d8c231;
  }
  if (tsd == (tsd_t *)0x0) {
    ctx = (rtree_ctx_t *)&stack0xfffffffffffffe50;
    duckdb_je_rtree_ctx_data_init(ctx);
  }
  else {
    ctx = &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
  }
  prVar8 = (rtree_leaf_elm_t *)((ulong)ptr & 0xffffffffc0000000);
  uVar10 = (ulong)(((uint)((ulong)ptr >> 0x1e) & 0xf) << 4);
  puVar2 = (ulong *)((long)&ctx->cache[0].leafkey + uVar10);
  prVar3 = *(rtree_leaf_elm_t **)((long)&ctx->cache[0].leafkey + uVar10);
  if (prVar3 == prVar8) {
    prVar8 = (rtree_leaf_elm_t *)((ulong)((uint)((ulong)ptr >> 9) & 0x1ffff8) + puVar2[1]);
  }
  else if ((rtree_leaf_elm_t *)ctx->l2_cache[0].leafkey == prVar8) {
    prVar6 = ctx->l2_cache[0].leaf;
    ctx->l2_cache[0].leafkey = (uintptr_t)prVar3;
    ctx->l2_cache[0].leaf = (rtree_leaf_elm_t *)puVar2[1];
    *puVar2 = (ulong)prVar8;
    puVar2[1] = (ulong)prVar6;
    prVar8 = (rtree_leaf_elm_t *)
             ((long)&(prVar6->le_bits).repr + (ulong)((uint)((ulong)ptr >> 9) & 0x1ffff8));
  }
  else {
    prVar13 = ctx->l2_cache + 1;
    if ((rtree_leaf_elm_t *)ctx->l2_cache[1].leafkey == prVar8) {
      uVar9 = 0;
      in_R8 = 0;
    }
    else {
      uVar10 = 1;
      prVar14 = prVar13;
      do {
        uVar9 = uVar10;
        uVar15 = (undefined7)(in_R8 >> 8);
        if (uVar9 == 7) {
          in_R8 = CONCAT71(uVar15,6 < uVar9);
          goto LAB_01d8c457;
        }
        prVar13 = prVar14 + 1;
        prVar1 = prVar14 + 1;
        uVar10 = uVar9 + 1;
        prVar14 = prVar13;
      } while ((rtree_leaf_elm_t *)prVar1->leafkey != prVar8);
      in_R8 = CONCAT71(uVar15,6 < uVar9);
    }
    prVar6 = prVar13->leaf;
    prVar13->leafkey = ctx->l2_cache[uVar9].leafkey;
    prVar13->leaf = ctx->l2_cache[uVar9].leaf;
    ctx->l2_cache[uVar9].leafkey = (uintptr_t)prVar3;
    ctx->l2_cache[uVar9].leaf = (rtree_leaf_elm_t *)puVar2[1];
    *puVar2 = (ulong)prVar8;
    puVar2[1] = (ulong)prVar6;
    prVar8 = (rtree_leaf_elm_t *)
             ((long)&(prVar6->le_bits).repr + (ulong)((uint)((ulong)ptr >> 9) & 0x1ffff8));
LAB_01d8c457:
    if ((char)in_R8 != '\0') {
      in_R8 = 1;
      prVar8 = duckdb_je_rtree_leaf_elm_lookup_hard
                         ((tsdn_t *)tsd,&duckdb_je_arena_emap_global.rtree,ctx,(uintptr_t)ptr,true,
                          false);
    }
  }
  ptVar16 = &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache;
  pvVar4 = (prVar8->le_bits).repr;
  uVar9 = (ulong)pvVar4 >> 0x30;
  uVar10 = duckdb_je_sz_index2size_tab[uVar9];
  uVar7 = (ushort)((ulong)pvVar4 >> 0x30);
  if (((ulong)pvVar4 & 1) == 0) {
    if (((uint)uVar7 < ptVar16->tcache_slow->tcache_nbins) &&
       (ppvVar11 = (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache).bins[uVar9].
                   stack_head, ppvVar11 != (void **)&duckdb_je_disabled_bin)) {
      pcVar12 = (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache).bins + uVar9;
      if ((tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache).bins[uVar9].
          low_bits_full == (uint16_t)ppvVar11) {
        duckdb_je_tcache_bin_flush_large
                  (tsd,ptVar16,pcVar12,(uint)uVar7,
                   (uint)((tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache).bins
                          [uVar9].bin_info.ncached_max >>
                         ((byte)duckdb_je_opt_lg_tcache_flush_large_div & 0x1f)));
        goto LAB_01d8c31e;
      }
      goto LAB_01d8c0a0;
    }
    if (tsd == (tsd_t *)0x0) {
      prVar17 = (rtree_t *)&stack0xfffffffffffffe50;
      duckdb_je_rtree_ctx_data_init((rtree_ctx_t *)prVar17);
    }
    else {
      prVar17 = (rtree_t *)&tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
    }
    rtree_read(&local_1e0,(tsdn_t *)tsd,prVar17,(rtree_ctx_t *)ptr,in_R8);
    duckdb_je_large_dalloc((tsdn_t *)tsd,local_1e0.edata);
  }
  else {
    pcVar12 = (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache).bins + uVar9;
    ppvVar11 = pcVar12->stack_head;
    if ((tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache).bins[uVar9].
        low_bits_full == (uint16_t)ppvVar11) {
      if (pcVar12->stack_head == (void **)&duckdb_je_disabled_bin) {
        duckdb_je_arena_dalloc_small((tsdn_t *)tsd,ptr);
      }
      else {
        duckdb_je_tcache_bin_flush_small
                  (tsd,ptVar16,pcVar12,(uint)uVar7,
                   (uint)((tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache).bins
                          [uVar9].bin_info.ncached_max >>
                         ((byte)duckdb_je_opt_lg_tcache_flush_small_div & 0x1f)));
LAB_01d8c31e:
        ppvVar11 = pcVar12->stack_head;
        if (pcVar12->low_bits_full != (uint16_t)ppvVar11) {
          pcVar12->stack_head = ppvVar11 + -1;
          ppvVar11[-1] = ptr;
        }
      }
    }
    else {
LAB_01d8c0a0:
      pcVar12->stack_head = ppvVar11 + -1;
      ppvVar11[-1] = ptr;
    }
  }
  uVar5 = tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated;
  tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated = uVar5 + uVar10;
  if (uVar10 < tsd->
               cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated_next_event -
               uVar5) {
    return;
  }
LAB_01d8c231:
  local_190 = &tsd->
               cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated_next_event_fast
  ;
  local_198 = &tsd->
               cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated_next_event;
  local_1a0 = &tsd->
               cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated_last_event;
  local_1a8 = &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated;
  local_1b0 = false;
  duckdb_je_te_event_trigger(tsd,(te_ctx_t *)&stack0xfffffffffffffe50);
  return;
}

Assistant:

JEMALLOC_NOINLINE
void
free_default(void *ptr) {
	UTRACE(ptr, 0, 0);
	if (likely(ptr != NULL)) {
		/*
		 * We avoid setting up tsd fully (e.g. tcache, arena binding)
		 * based on only free() calls -- other activities trigger the
		 * minimal to full transition.  This is because free() may
		 * happen during thread shutdown after tls deallocation: if a
		 * thread never had any malloc activities until then, a
		 * fully-setup tsd won't be destructed properly.
		 */
		tsd_t *tsd = tsd_fetch_min();
		check_entry_exit_locking(tsd_tsdn(tsd));

		if (likely(tsd_fast(tsd))) {
			tcache_t *tcache = tcache_get_from_ind(tsd,
			    TCACHE_IND_AUTOMATIC, /* slow */ false,
			    /* is_alloc */ false);
			ifree(tsd, ptr, tcache, /* slow */ false);
		} else {
			tcache_t *tcache = tcache_get_from_ind(tsd,
			    TCACHE_IND_AUTOMATIC, /* slow */ true,
			    /* is_alloc */ false);
			uintptr_t args_raw[3] = {(uintptr_t)ptr};
			hook_invoke_dalloc(hook_dalloc_free, ptr, args_raw);
			ifree(tsd, ptr, tcache, /* slow */ true);
		}

		check_entry_exit_locking(tsd_tsdn(tsd));
	}
}